

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_descriptor_pkh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  if (script_len < 0x19) {
    node_local._4_4_ = -2;
  }
  else {
    node_local._4_4_ =
         generate_by_miniscript_pk_h(node,parent,derive_child_num,script,script_len,write_len);
    if (node_local._4_4_ == 0) {
      node_local._4_4_ = generate_by_wrapper_c(script,script_len,write_len);
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_descriptor_pkh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;

    if (script_len < WALLY_SCRIPTPUBKEY_P2PKH_LEN)
        return WALLY_EINVAL;

    ret = generate_by_miniscript_pk_h(node, parent, derive_child_num, script, script_len, write_len);
    if (ret != WALLY_OK)
        return ret;

    return generate_by_wrapper_c(script, script_len, write_len);
}